

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_ray * rf_get_mouse_ray(rf_ray *__return_storage_ptr__,rf_sizei screen_size,rf_vec2 mouse_position
                         ,rf_camera3d camera)

{
  double dVar1;
  double dVar2;
  rf_mat proj;
  rf_mat proj_00;
  rf_mat proj_01;
  rf_mat view;
  rf_mat view_00;
  rf_mat view_01;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  rf_vec3 rVar16;
  rf_vec3 rVar17;
  rf_vec3 rVar18;
  rf_mat result;
  rf_mat mat_view;
  ulong local_f8;
  undefined8 uStack_f0;
  long local_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d0;
  undefined8 uStack_c0;
  float local_b8;
  float fStack_b4;
  float local_78;
  float fStack_74;
  rf_mat local_68;
  
  (__return_storage_ptr__->position).x = 0.0;
  (__return_storage_ptr__->position).y = 0.0;
  *(undefined8 *)&(__return_storage_ptr__->position).z = 0;
  fVar8 = (float)screen_size.width;
  fVar4 = (mouse_position.x + mouse_position.x) / fVar8 + -1.0;
  (__return_storage_ptr__->direction).y = 0.0;
  (__return_storage_ptr__->direction).z = 0.0;
  fVar5 = (float)screen_size.height;
  fVar6 = 1.0 - (mouse_position.y + mouse_position.y) / fVar5;
  rf_mat_look_at(&local_68,camera.position,camera.target,camera.up);
  uStack_f0 = 0;
  uStack_e0 = 0;
  local_f8 = 0x3f800000;
  uVar3 = 0x3f800000;
  uStack_d0 = 0x3f800000;
  uStack_c0 = 0x3f80000000000000;
  if (camera.type == RF_CAMERA_ORTHOGRAPHIC) {
    fVar9 = camera.fovy * 0.5;
    fVar5 = (fVar8 / fVar5) * fVar9;
    fVar7 = 2.0 / (fVar5 + fVar5);
    fVar8 = 2.0 / (fVar9 + fVar9);
    fVar5 = -(fVar5 - fVar5) / (fVar5 + fVar5);
    fVar10 = -(fVar9 - fVar9) / (fVar9 + fVar9);
    uVar12 = 0xbf8000a8;
    uVar13 = 0xbb0312c5;
    fVar9 = 0.0;
    fVar11 = 0.0;
    uVar14 = 0;
    uVar15 = 0x3f800000;
  }
  else {
    if (camera.type != RF_CAMERA_PERSPECTIVE) goto LAB_00125ab2;
    dVar1 = tan((double)(camera.fovy * 0.017453292) * 0.5);
    dVar1 = dVar1 * 0.01;
    dVar2 = ((double)screen_size.width / (double)screen_size.height) * dVar1;
    fVar7 = 0.02 / (float)(dVar2 + dVar2);
    fVar8 = 0.02 / (float)(dVar1 + dVar1);
    fVar9 = ((float)dVar2 - (float)dVar2) / (float)(dVar2 + dVar2);
    fVar11 = ((float)dVar1 - (float)dVar1) / (float)(dVar1 + dVar1);
    uVar14 = 0xbf800000;
    uVar12 = 0xbca3d776;
    uVar13 = 0xbf8000a8;
    fVar5 = 0.0;
    fVar10 = 0.0;
    uVar15 = 0;
  }
  local_f8 = (ulong)(uint)fVar7;
  uStack_f0 = CONCAT44(fVar5,fVar9);
  uVar3 = (ulong)(uint)fVar8;
  uStack_e0 = CONCAT44(fVar10,fVar11);
  uStack_d0 = CONCAT44(uVar12,uVar13);
  uStack_c0 = CONCAT44(uVar15,uVar14);
LAB_00125ab2:
  local_e8 = uVar3 << 0x20;
  proj.m8 = (float)(undefined4)uStack_f0;
  proj.m12 = (float)uStack_f0._4_4_;
  proj.m0 = (float)(undefined4)local_f8;
  proj.m4 = (float)local_f8._4_4_;
  proj.m1 = (float)(undefined4)local_e8;
  proj.m5 = (float)local_e8._4_4_;
  proj.m9 = (float)(undefined4)uStack_e0;
  proj.m13 = (float)uStack_e0._4_4_;
  proj.m2 = 0.0;
  proj.m6 = 0.0;
  proj.m10 = (float)(undefined4)uStack_d0;
  proj.m14 = (float)uStack_d0._4_4_;
  proj.m3 = 0.0;
  proj.m7 = 0.0;
  proj.m11 = (float)(undefined4)uStack_c0;
  proj.m15 = (float)uStack_c0._4_4_;
  view.m8 = local_68.m8;
  view.m12 = local_68.m12;
  view.m0 = local_68.m0;
  view.m4 = local_68.m4;
  view.m1 = local_68.m1;
  view.m5 = local_68.m5;
  view.m9 = local_68.m9;
  view.m13 = local_68.m13;
  view.m2 = local_68.m2;
  view.m6 = local_68.m6;
  view.m10 = local_68.m10;
  view.m14 = local_68.m14;
  view.m3 = local_68.m3;
  view.m7 = local_68.m7;
  view.m11 = local_68.m11;
  view.m15 = local_68.m15;
  rVar16.y = fVar6;
  rVar16.x = fVar4;
  rVar16.z = 0.0;
  rVar16 = rf_unproject(rVar16,proj,view);
  rVar17.y = fVar6;
  rVar17.x = fVar4;
  proj_00.m8 = (float)(undefined4)uStack_f0;
  proj_00.m12 = (float)uStack_f0._4_4_;
  proj_00.m0 = (float)(undefined4)local_f8;
  proj_00.m4 = (float)local_f8._4_4_;
  proj_00.m1 = (float)(undefined4)local_e8;
  proj_00.m5 = (float)local_e8._4_4_;
  proj_00.m9 = (float)(undefined4)uStack_e0;
  proj_00.m13 = (float)uStack_e0._4_4_;
  proj_00.m2 = 0.0;
  proj_00.m6 = 0.0;
  proj_00.m10 = (float)(undefined4)uStack_d0;
  proj_00.m14 = (float)uStack_d0._4_4_;
  proj_00.m3 = 0.0;
  proj_00.m7 = 0.0;
  proj_00.m11 = (float)(undefined4)uStack_c0;
  proj_00.m15 = (float)uStack_c0._4_4_;
  view_00.m8 = local_68.m8;
  view_00.m12 = local_68.m12;
  view_00.m0 = local_68.m0;
  view_00.m4 = local_68.m4;
  view_00.m1 = local_68.m1;
  view_00.m5 = local_68.m5;
  view_00.m9 = local_68.m9;
  view_00.m13 = local_68.m13;
  view_00.m2 = local_68.m2;
  view_00.m6 = local_68.m6;
  view_00.m10 = local_68.m10;
  view_00.m14 = local_68.m14;
  view_00.m3 = local_68.m3;
  view_00.m7 = local_68.m7;
  view_00.m11 = local_68.m11;
  view_00.m15 = local_68.m15;
  rVar17.z = 1.0;
  rVar17 = rf_unproject(rVar17,proj_00,view_00);
  rVar18.y = fVar6;
  rVar18.x = fVar4;
  proj_01.m8 = (float)(undefined4)uStack_f0;
  proj_01.m12 = (float)uStack_f0._4_4_;
  proj_01.m0 = (float)(undefined4)local_f8;
  proj_01.m4 = (float)local_f8._4_4_;
  proj_01.m1 = (float)(undefined4)local_e8;
  proj_01.m5 = (float)local_e8._4_4_;
  proj_01.m9 = (float)(undefined4)uStack_e0;
  proj_01.m13 = (float)uStack_e0._4_4_;
  proj_01.m2 = 0.0;
  proj_01.m6 = 0.0;
  proj_01.m10 = (float)(undefined4)uStack_d0;
  proj_01.m14 = (float)uStack_d0._4_4_;
  proj_01.m3 = 0.0;
  proj_01.m7 = 0.0;
  proj_01.m11 = (float)(undefined4)uStack_c0;
  proj_01.m15 = (float)uStack_c0._4_4_;
  view_01.m8 = local_68.m8;
  view_01.m12 = local_68.m12;
  view_01.m0 = local_68.m0;
  view_01.m4 = local_68.m4;
  view_01.m1 = local_68.m1;
  view_01.m5 = local_68.m5;
  view_01.m9 = local_68.m9;
  view_01.m13 = local_68.m13;
  view_01.m2 = local_68.m2;
  view_01.m6 = local_68.m6;
  view_01.m10 = local_68.m10;
  view_01.m14 = local_68.m14;
  view_01.m3 = local_68.m3;
  view_01.m7 = local_68.m7;
  view_01.m11 = local_68.m11;
  view_01.m15 = local_68.m15;
  rVar18.z = -1.0;
  rVar18 = rf_unproject(rVar18,proj_01,view_01);
  local_b8 = rVar17.x;
  fStack_b4 = rVar17.y;
  local_78 = rVar16.x;
  fStack_74 = rVar16.y;
  local_b8 = local_b8 - local_78;
  fStack_b4 = fStack_b4 - fStack_74;
  fVar5 = rVar17.z - rVar16.z;
  fVar4 = fVar5 * fVar5 + local_b8 * local_b8 + fStack_b4 * fStack_b4;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  if (camera.type == RF_CAMERA_ORTHOGRAPHIC) {
    (__return_storage_ptr__->position).x = (float)(int)rVar18._0_8_;
    (__return_storage_ptr__->position).y = (float)(int)((ulong)rVar18._0_8_ >> 0x20);
    (__return_storage_ptr__->position).z = rVar18.z;
  }
  else if (camera.type == RF_CAMERA_PERSPECTIVE) {
    (__return_storage_ptr__->position).z = camera.position.z;
    (__return_storage_ptr__->position).x = camera.position.x;
    (__return_storage_ptr__->position).y = camera.position.y;
  }
  fVar4 = (float)(-(uint)(fVar4 == 0.0) & 0x3f800000 | ~-(uint)(fVar4 == 0.0) & (uint)(1.0 / fVar4))
  ;
  (__return_storage_ptr__->direction).x = local_b8 * fVar4;
  (__return_storage_ptr__->direction).y = fStack_b4 * fVar4;
  (__return_storage_ptr__->direction).z = fVar5 * fVar4;
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_ray rf_get_mouse_ray(rf_sizei screen_size, rf_vec2 mouse_position, rf_camera3d camera)
{
    rf_ray ray = {0};

    // Calculate normalized device coordinates
    // NOTE: y value is negative
    float x = (2.0f * mouse_position.x) / (float) screen_size.width - 1.0f;
    float y = 1.0f - (2.0f * mouse_position.y) / (float) screen_size.height;
    float z = 1.0f;

    // Store values in a vector
    rf_vec3 device_coords = { x, y, z };

    // Calculate view matrix from camera look at
    rf_mat mat_view = rf_mat_look_at(camera.position, camera.target, camera.up);

    rf_mat mat_proj = rf_mat_identity();

    if (camera.type == RF_CAMERA_PERSPECTIVE)
    {
        // Calculate projection matrix from perspective
        mat_proj = rf_mat_perspective(camera.fovy * RF_DEG2RAD, ((double) screen_size.width / (double) screen_size.height), 0.01, 1000.0);
    }
    else if (camera.type == RF_CAMERA_ORTHOGRAPHIC)
    {
        float aspect = (float) screen_size.width / (float) screen_size.height;
        double top = camera.fovy / 2.0;
        double right = top * aspect;

        // Calculate projection matrix from orthographic
        mat_proj = rf_mat_ortho(-right, right, -top, top, 0.01, 1000.0);
    }

    // Unproject far/near points
    rf_vec3 near_point = rf_unproject((rf_vec3) {device_coords.x, device_coords.y, 0.0f}, mat_proj, mat_view);
    rf_vec3 far_point  = rf_unproject((rf_vec3) {device_coords.x, device_coords.y, 1.0f}, mat_proj, mat_view);

    // Unproject the mouse cursor in the near plane.
    // We need this as the source position because orthographic projects, compared to perspect doesn't have a
    // convergence point, meaning that the "eye" of the camera is more like a plane than a point.
    rf_vec3 camera_plane_pointer_pos = rf_unproject((rf_vec3) {device_coords.x, device_coords.y, -1.0f}, mat_proj,
                                                    mat_view);

    // Calculate normalized direction vector
    rf_vec3 direction = rf_vec3_normalize(rf_vec3_sub(far_point, near_point));

    if (camera.type == RF_CAMERA_PERSPECTIVE)
    {
        ray.position = camera.position;
    }
    else if (camera.type == RF_CAMERA_ORTHOGRAPHIC)
    {
        ray.position = camera_plane_pointer_pos;
    }

    // Apply calculated vectors to ray
    ray.direction = direction;

    return ray;
}